

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_pipe_get_recvmax(void *arg,void *v,size_t *szp,nni_type t)

{
  long lVar1;
  int iVar2;
  int rv;
  udp_ep *ep;
  udp_pipe *p;
  nni_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  lVar1 = *arg;
  nni_mtx_lock((nni_mtx *)(lVar1 + 8));
  iVar2 = nni_copyout_size((ulong)*(ushort *)((long)arg + 0xae),v,szp,t);
  nni_mtx_unlock((nni_mtx *)(lVar1 + 8));
  return iVar2;
}

Assistant:

static int
udp_pipe_get_recvmax(void *arg, void *v, size_t *szp, nni_type t)
{
	udp_pipe *p  = arg;
	udp_ep   *ep = p->ep;
	int       rv;
	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_size(p->rcvmax, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}